

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsParticle_dns.c
# Opt level: O0

int f(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double *pdVar1;
  double *pdVar2;
  double *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sunrealtype *fdata;
  sunrealtype *ydata;
  UserData udata;
  
  pdVar1 = (double *)N_VGetArrayPointer(in_RDI);
  pdVar2 = (double *)N_VGetArrayPointer(in_RSI);
  *pdVar2 = -*in_RDX * pdVar1[1];
  pdVar2[1] = *in_RDX * *pdVar1;
  return 0;
}

Assistant:

static int f(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  UserData udata     = (UserData)user_data;
  sunrealtype* ydata = N_VGetArrayPointer(y);
  sunrealtype* fdata = N_VGetArrayPointer(ydot);

  fdata[0] = -(udata->alpha) * ydata[1];
  fdata[1] = (udata->alpha) * ydata[0];

  return (0);
}